

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test::TestBody
          (CommandLineInterfaceTest_GeneratorAndPlugin_DescriptorSetIn_Test *this)

{
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>_>
  *pVVar1;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_> *pVVar2;
  Arena *pAVar3;
  string_view filename;
  allocator<char> local_fc;
  allocator<char> local_fb;
  allocator<char> local_fa;
  allocator<char> local_f9;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  FileDescriptorSet file_descriptor_set;
  
  FileDescriptorSet::FileDescriptorSet(&file_descriptor_set);
  pVVar1 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>>
                     (&file_descriptor_set.field_0._impl_.file_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar1->field_0 = *(byte *)&pVVar1->field_0 | 1;
  pAVar3 = (Arena *)(pVVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar1->field_0)._impl_.name_,"foo.proto",pAVar3);
  pVVar2 = protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                     (&(pVVar1->field_0)._impl_.message_type_.super_RepeatedPtrFieldBase);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar3 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar3 & 1) != 0) {
    pAVar3 = *(Arena **)((ulong)pAVar3 & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.name_,"Foo",pAVar3);
  filename._M_str = "foo.bin";
  filename._M_len = 7;
  CommandLineInterfaceTest::WriteDescriptorSet
            (&this->super_CommandLineInterfaceTest,filename,&file_descriptor_set);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir --descriptor_set_in=$tmpdir/foo.bin foo.proto"
             ,(allocator<char> *)&local_f8);
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"test_generator",&local_f9)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,anon_var_dwarf_651463 + 5,&local_fa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"foo.proto",&local_fb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Foo",&local_fc);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_f8,&local_98,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"test_plugin",&local_f9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,anon_var_dwarf_651463 + 5,&local_fa);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"foo.proto",&local_fb);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Foo",&local_fc);
  CommandLineInterfaceTest::ExpectGenerated
            (&this->super_CommandLineInterfaceTest,&local_f8,&local_98,&local_b8,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  FileDescriptorSet::~FileDescriptorSet(&file_descriptor_set);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, GeneratorAndPlugin_DescriptorSetIn) {
  // Invoke a generator and a plugin at the same time.

  FileDescriptorSet file_descriptor_set;
  FileDescriptorProto* file_descriptor_proto = file_descriptor_set.add_file();
  file_descriptor_proto->set_name("foo.proto");
  file_descriptor_proto->add_message_type()->set_name("Foo");

  WriteDescriptorSet("foo.bin", &file_descriptor_set);

  Run("protocol_compiler --test_out=$tmpdir --plug_out=$tmpdir "
      "--descriptor_set_in=$tmpdir/foo.bin foo.proto");

  ExpectNoErrors();
  ExpectGenerated("test_generator", "", "foo.proto", "Foo");
  ExpectGenerated("test_plugin", "", "foo.proto", "Foo");
}